

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# numparse_stringsegment.cpp
# Opt level: O1

UnicodeString * __thiscall
icu_63::numparse::impl::StringSegment::toTempUnicodeString
          (UnicodeString *__return_storage_ptr__,StringSegment *this)

{
  ushort uVar1;
  char16_t *pcVar2;
  ConstChar16Ptr local_20 [3];
  
  uVar1 = (this->fStr).fUnion.fStackFields.fLengthAndFlags;
  if ((uVar1 & 0x11) == 0) {
    if ((uVar1 & 2) == 0) {
      pcVar2 = (this->fStr).fUnion.fFields.fArray;
    }
    else {
      pcVar2 = (char16_t *)((long)&(this->fStr).fUnion + 2);
    }
  }
  else {
    pcVar2 = (char16_t *)0x0;
  }
  local_20[0].p_ = pcVar2 + this->fStart;
  UnicodeString::UnicodeString(__return_storage_ptr__,'\0',local_20,this->fEnd - this->fStart);
  return __return_storage_ptr__;
}

Assistant:

const UnicodeString StringSegment::toTempUnicodeString() const {
    // Use the readonly-aliasing constructor for efficiency.
    return UnicodeString(FALSE, fStr.getBuffer() + fStart, fEnd - fStart);
}